

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingScene::Camera
          (FormattingScene *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  bool bVar1;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  long in_RDI;
  ParameterDictionary dict;
  string *in_stack_fffffffffffffe58;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffe60;
  ParameterDictionary *this_00;
  undefined6 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 in_stack_fffffffffffffe6f;
  RGBColorSpace *colorSpace;
  int extra;
  FormattingScene *in_stack_fffffffffffffe88;
  ParameterDictionary *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  allocator<char> local_151;
  string local_150 [32];
  string local_130 [4];
  undefined4 in_stack_fffffffffffffed4;
  undefined8 in_stack_fffffffffffffed8;
  string local_110 [48];
  RGBColorSpace local_e0;
  
  colorSpace = &local_e0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(in_RDX,(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                          *)CONCAT17(in_stack_fffffffffffffe6f,
                                     CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)))
  ;
  ParameterDictionary::ParameterDictionary
            (in_stack_fffffffffffffe90,(ParsedParameterVector *)in_stack_fffffffffffffe88,colorSpace
            );
  extra = (int)((ulong)colorSpace >> 0x20);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(in_stack_fffffffffffffe60);
  if (((*(byte *)(in_RDI + 0x11) & 1) == 0) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58), !bVar1))
  {
    indent_abi_cxx11_(in_stack_fffffffffffffe88,extra);
    Printf<std::__cxx11::string,std::__cxx11::string_const&>
              ((char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe90);
    std::__cxx11::string::~string(local_130);
  }
  else {
    indent_abi_cxx11_(in_stack_fffffffffffffe88,extra);
    Printf<std::__cxx11::string>
              ((char *)in_stack_fffffffffffffe90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe88);
    std::__cxx11::string::~string(local_110);
  }
  if (((*(byte *)(in_RDI + 0x11) & 1) != 0) &&
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58), bVar1))
  {
    this_00 = (ParameterDictionary *)&local_151;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98,
               (allocator<char> *)in_stack_fffffffffffffe90);
    ParameterDictionary::RemoveBool(this_00,in_stack_fffffffffffffe58);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator(&local_151);
  }
  ParameterDictionary::ToParameterList_abi_cxx11_
            ((ParameterDictionary *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
  std::operator<<((ostream *)&std::cout,(string *)&stack0xfffffffffffffe88);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe88);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x9d4d69);
  return;
}

Assistant:

void FormattingScene::Camera(const std::string &name, ParsedParameterVector params,
                             FileLoc loc) {
    ParameterDictionary dict(std::move(params), RGBColorSpace::sRGB);

    if (upgrade && name == "environment")
        Printf("%sCamera \"spherical\" \"string mapping\" \"equirectangular\"\n",
               indent());
    else
        Printf("%sCamera \"%s\"\n", indent(), name);
    if (upgrade && name == "realistic")
        dict.RemoveBool("simpleweighting");

    std::cout << dict.ToParameterList(catIndentCount);
}